

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
          (Matcher<std::optional<solitaire::cards::Card>_&> *this,
          optional<solitaire::cards::Card> *value)

{
  undefined4 extraout_EDX;
  optional<solitaire::cards::Card> x;
  EqMatcher<std::optional<solitaire::cards::Card>_> EVar1;
  undefined4 local_78;
  _Storage<solitaire::cards::Card,_true> local_40;
  undefined4 local_38;
  Matcher<std::optional<solitaire::cards::Card>_&> local_30;
  optional<solitaire::cards::Card> *local_18;
  optional<solitaire::cards::Card> *value_local;
  Matcher<std::optional<solitaire::cards::Card>_&> *this_local;
  
  local_18 = value;
  value_local = (optional<solitaire::cards::Card> *)this;
  internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::MatcherBase
            (&this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>);
  (this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>).super_MatcherDescriberInterface
  ._vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_004f9930;
  x.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload._M_value.suit = 0;
  x.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload._M_value.value =
       *(uint *)&(local_18->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
                 super__Optional_payload_base<solitaire::cards::Card>._M_engaged;
  x.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._8_4_ = extraout_EDX;
  EVar1 = Eq<std::optional<solitaire::cards::Card>>
                    ((testing *)
                     (local_18->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload
                     .super__Optional_payload_base<solitaire::cards::Card>._M_payload,x);
  local_40 = EVar1.
             super_ComparisonBase<testing::internal::EqMatcher<std::optional<solitaire::cards::Card>_>,_std::optional<solitaire::cards::Card>,_testing::internal::AnyEq>
             .rhs_.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
             super__Optional_payload_base<solitaire::cards::Card>._M_payload;
  local_78 = CONCAT31(local_78._1_3_,
                      EVar1.
                      super_ComparisonBase<testing::internal::EqMatcher<std::optional<solitaire::cards::Card>_>,_std::optional<solitaire::cards::Card>,_testing::internal::AnyEq>
                      .rhs_.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
                      super__Optional_payload_base<solitaire::cards::Card>._M_engaged);
  local_38 = local_78;
  Matcher<std::optional<solitaire::cards::Card>&>::
  Matcher<testing::internal::EqMatcher<std::optional<solitaire::cards::Card>>,void>
            ((Matcher<std::optional<solitaire::cards::Card>&> *)&local_30,
             (EqMatcher<std::optional<solitaire::cards::Card>_> *)&local_40._M_value);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }